

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  short sVar2;
  long lVar3;
  Window *pWVar4;
  sqlite3 *db;
  int iVar5;
  Expr *pEVar6;
  CollSeq *pCVar7;
  CollSeq *pCVar8;
  uint uVar9;
  char *zC;
  Expr *p;
  long in_FS_OFFSET;
  Expr ifNullRow;
  
  lVar3 = *(long *)(in_FS_OFFSET + 0x28);
  if (pExpr == (Expr *)0x0) {
    pExpr = (Expr *)0x0;
    goto LAB_001858dc;
  }
  if (((pExpr->flags & 3) != 0) && ((pExpr->w).iJoin == pSubst->iTable)) {
    pExpr->w = (anon_union_4_2_009eaf8f_for_w)pSubst->iNewTable;
  }
  if (pExpr->op == 0xb3) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
  }
  else if (((pExpr->op == 0xa8) && ((pExpr->flags & 0x20) == 0)) &&
          (pExpr->iTable == pSubst->iTable)) {
    ifNullRow.y.pTab = (Table *)&DAT_aaaaaaaaaaaaaaaa;
    ifNullRow._48_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ifNullRow.pAggInfo = (AggInfo *)&DAT_aaaaaaaaaaaaaaaa;
    ifNullRow.x.pList = (ExprList *)&DAT_aaaaaaaaaaaaaaaa;
    ifNullRow._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ifNullRow.pLeft = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
    ifNullRow.pRight = (Expr *)&DAT_aaaaaaaaaaaaaaaa;
    ifNullRow._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    ifNullRow.u.zToken = &DAT_aaaaaaaaaaaaaaaa;
    sVar2 = pExpr->iColumn;
    pEVar6 = pSubst->pEList->a[sVar2].pExpr;
    iVar5 = sqlite3ExprIsVector(pEVar6);
    if (iVar5 != 0) {
      sqlite3VectorErrorMsg(pSubst->pParse,pEVar6);
      goto LAB_001858dc;
    }
    db = pSubst->pParse->db;
    p = pEVar6;
    if (pSubst->isOuterJoin != 0) {
      if (pEVar6->op == 0xa8) {
        uVar9 = pSubst->iNewTable;
        if (pEVar6->iTable == uVar9) goto LAB_00185958;
      }
      else {
        uVar9 = pSubst->iNewTable;
      }
      ifNullRow.u.zToken = (char *)0x0;
      ifNullRow.pRight = (Expr *)0x0;
      ifNullRow.y.pTab = (Table *)0x0;
      ifNullRow.x.pList = (ExprList *)0x0;
      ifNullRow.pAggInfo = (AggInfo *)0x0;
      ifNullRow._40_8_ = (ulong)uVar9 << 0x20;
      ifNullRow.iColumn = -99;
      ifNullRow.iAgg = 0;
      ifNullRow.w = (anon_union_4_2_009eaf8f_for_w)0x0;
      ifNullRow.op = 0xb3;
      ifNullRow.affExpr = '\0';
      ifNullRow.op2 = '\0';
      ifNullRow._3_1_ = 0;
      ifNullRow.flags = 0x40000;
      p = &ifNullRow;
      ifNullRow.pLeft = pEVar6;
    }
LAB_00185958:
    pEVar6 = sqlite3ExprDup(db,p,0);
    if (db->mallocFailed == '\0') {
      if (pSubst->isOuterJoin != 0) {
        pbVar1 = (byte *)((long)&pEVar6->flags + 2);
        *pbVar1 = *pbVar1 | 0x20;
      }
      if (pEVar6->op == 0xab) {
        iVar5 = sqlite3ExprTruthValue(pEVar6);
        (pEVar6->u).iValue = iVar5;
        pEVar6->op = 0x9c;
        pbVar1 = (byte *)((long)&pEVar6->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
      pCVar7 = sqlite3ExprCollSeq(pSubst->pParse,pEVar6);
      pCVar8 = sqlite3ExprCollSeq(pSubst->pParse,pSubst->pCList->a[sVar2].pExpr);
      if ((pCVar7 != pCVar8) || ((pEVar6->op != 'r' && (pEVar6->op != 0xa8)))) {
        if (pCVar8 == (CollSeq *)0x0) {
          zC = "BINARY";
        }
        else {
          zC = pCVar8->zName;
        }
        pEVar6 = sqlite3ExprAddCollateString(pSubst->pParse,pEVar6,zC);
      }
      pbVar1 = (byte *)((long)&pEVar6->flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      uVar9 = pExpr->flags & 3;
      if (uVar9 != 0) {
        sqlite3SetJoinExpr(pEVar6,(pExpr->w).iJoin,uVar9);
      }
      sqlite3ExprDeleteNN(db,pExpr);
      pExpr = pEVar6;
    }
    else {
      sqlite3ExprDelete(db,pEVar6);
    }
    goto LAB_001858dc;
  }
  pEVar6 = substExpr(pSubst,pExpr->pLeft);
  pExpr->pLeft = pEVar6;
  pEVar6 = substExpr(pSubst,pExpr->pRight);
  pExpr->pRight = pEVar6;
  if ((pExpr->flags & 0x1000) == 0) {
    substExprList(pSubst,(pExpr->x).pList);
  }
  else {
    substSelect(pSubst,(Select *)(pExpr->x).pList,1);
  }
  if ((pExpr->flags & 0x1000000) != 0) {
    pWVar4 = (pExpr->y).pWin;
    pEVar6 = substExpr(pSubst,pWVar4->pFilter);
    pWVar4->pFilter = pEVar6;
    substExprList(pSubst,pWVar4->pPartition);
    substExprList(pSubst,pWVar4->pOrderBy);
  }
LAB_001858dc:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar3) {
    __stack_chk_fail();
  }
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_OuterON|EP_InnerON)
   && pExpr->w.iJoin==pSubst->iTable
  ){
    testcase( ExprHasProperty(pExpr, EP_InnerON) );
    pExpr->w.iJoin = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN
   && pExpr->iTable==pSubst->iTable
   && !ExprHasProperty(pExpr, EP_FixedCol)
  ){
#ifdef SQLITE_ALLOW_ROWID_IN_VIEW
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else
#endif
    {
      Expr *pNew;
      int iColumn;
      Expr *pCopy;
      Expr ifNullRow;
      iColumn = pExpr->iColumn;
      assert( iColumn>=0 );
      assert( pSubst->pEList!=0 && iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pRight==0 );
      pCopy = pSubst->pEList->a[iColumn].pExpr;
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isOuterJoin
         && (pCopy->op!=TK_COLUMN || pCopy->iTable!=pSubst->iNewTable)
        ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          ifNullRow.iColumn = -99;
          ifNullRow.flags = EP_IfNullRow;
          pCopy = &ifNullRow;
        }
        testcase( ExprHasProperty(pCopy, EP_Subquery) );
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( db->mallocFailed ){
          sqlite3ExprDelete(db, pNew);
          return pExpr;
        }
        if( pSubst->isOuterJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew->op==TK_TRUEFALSE ){
          pNew->u.iValue = sqlite3ExprTruthValue(pNew);
          pNew->op = TK_INTEGER;
          ExprSetProperty(pNew, EP_IntValue);
        }

        /* Ensure that the expression now has an implicit collation sequence,
        ** just as it did when it was a column of a view or sub-query. */
        {
          CollSeq *pNat = sqlite3ExprCollSeq(pSubst->pParse, pNew);
          CollSeq *pColl = sqlite3ExprCollSeq(pSubst->pParse,
                pSubst->pCList->a[iColumn].pExpr
          );
          if( pNat!=pColl || (pNew->op!=TK_COLUMN && pNew->op!=TK_COLLATE) ){
            pNew = sqlite3ExprAddCollateString(pSubst->pParse, pNew,
                (pColl ? pColl->zName : "BINARY")
            );
          }
        }
        ExprClearProperty(pNew, EP_Collate);
        if( ExprHasProperty(pExpr,EP_OuterON|EP_InnerON) ){
          sqlite3SetJoinExpr(pNew, pExpr->w.iJoin,
                             pExpr->flags & (EP_OuterON|EP_InnerON));
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprUseXSelect(pExpr) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
#ifndef SQLITE_OMIT_WINDOWFUNC
    if( ExprHasProperty(pExpr, EP_WinFunc) ){
      Window *pWin = pExpr->y.pWin;
      pWin->pFilter = substExpr(pSubst, pWin->pFilter);
      substExprList(pSubst, pWin->pPartition);
      substExprList(pSubst, pWin->pOrderBy);
    }
#endif
  }
  return pExpr;
}